

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_nearest_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar9 [64];
  __m512 _v;
  int i;
  int *offset_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  int local_478;
  int *local_420;
  undefined8 *local_3d0;
  int local_378;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  
  lVar6 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar7 = in_RSI[6];
  iVar2 = *(int *)((long)in_RSI + 0x34);
  for (local_378 = 0; local_378 < (int)lVar6; local_378 = local_378 + 1) {
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    local_3d0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_378 * in_RSI[2]);
    local_420 = (int *)*in_RDX;
    for (local_478 = 0; local_478 < iVar1 * (int)lVar7 * iVar2; local_478 = local_478 + 1) {
      if (*local_420 < 0) {
        auVar9 = vbroadcastss_avx512f(ZEXT416(0));
        local_200 = auVar9._0_8_;
        uStack_1f8 = auVar9._8_8_;
        uStack_1f0 = auVar9._16_8_;
        uStack_1e8 = auVar9._24_8_;
        uStack_1e0 = auVar9._32_8_;
        uStack_1d8 = auVar9._40_8_;
        uStack_1d0 = auVar9._48_8_;
        uStack_1c8 = auVar9._56_8_;
        local_580 = local_200;
        uStack_578 = uStack_1f8;
        uStack_570 = uStack_1f0;
        uStack_568 = uStack_1e8;
        uStack_560 = uStack_1e0;
        uStack_558 = uStack_1d8;
        uStack_550 = uStack_1d0;
        uStack_548 = uStack_1c8;
      }
      else {
        puVar8 = (undefined8 *)(lVar3 + lVar4 * local_378 * lVar5 + (long)*local_420 * 4);
        local_580 = *puVar8;
        uStack_578 = puVar8[1];
        uStack_570 = puVar8[2];
        uStack_568 = puVar8[3];
        uStack_560 = puVar8[4];
        uStack_558 = puVar8[5];
        uStack_550 = puVar8[6];
        uStack_548 = puVar8[7];
      }
      local_420 = local_420 + 1;
      *local_3d0 = local_580;
      local_3d0[1] = uStack_578;
      local_3d0[2] = uStack_570;
      local_3d0[3] = uStack_568;
      local_3d0[4] = uStack_560;
      local_3d0[5] = uStack_558;
      local_3d0[6] = uStack_550;
      local_3d0[7] = uStack_548;
      local_3d0 = local_3d0 + 8;
    }
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p16(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m512 _v = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
            offset_ptr++;

            _mm512_storeu_ps(dstptr, _v);
            dstptr += 16;
        }
    }
}